

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# I2cSimulationDataGenerator.cpp
# Opt level: O3

void __thiscall I2cSimulationDataGenerator::CreateStart(I2cSimulationDataGenerator *this)

{
  int iVar1;
  uint uVar2;
  
  uVar2 = (int)this + 0x18;
  ClockGenerator::AdvanceByHalfPeriod(1.0);
  SimulationChannelDescriptorGroup::AdvanceAll(uVar2);
  SafeChangeSda(this,BIT_HIGH);
  iVar1 = SimulationChannelDescriptor::GetCurrentBitState();
  if (iVar1 == 0) {
    SimulationChannelDescriptor::Transition();
    ClockGenerator::AdvanceByHalfPeriod(1.0);
    SimulationChannelDescriptorGroup::AdvanceAll(uVar2);
  }
  SimulationChannelDescriptor::Transition();
  ClockGenerator::AdvanceByHalfPeriod(1.0);
  SimulationChannelDescriptorGroup::AdvanceAll(uVar2);
  return;
}

Assistant:

void I2cSimulationDataGenerator::CreateStart()
{
    mI2cSimulationChannels.AdvanceAll( mClockGenerator.AdvanceByHalfPeriod( 1.0 ) );

    // 1st, we need to make SDA high,
    SafeChangeSda( BIT_HIGH );

    // 2nd, we need make the clock high.
    if( mScl->GetCurrentBitState() == BIT_LOW )
    {
        mScl->Transition();
        mI2cSimulationChannels.AdvanceAll( mClockGenerator.AdvanceByHalfPeriod( 1.0 ) );
    }

    // 3rd, bring SDA high.
    mSda->Transition();
    mI2cSimulationChannels.AdvanceAll( mClockGenerator.AdvanceByHalfPeriod( 1.0 ) );
}